

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall
QList<std::pair<int,_int>_>::remove(QList<std::pair<int,_int>_> *this,char *__filename)

{
  QList<std::pair<int,_int>_> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  pair<int,_int> *in_stack_00000018;
  QPodArrayOps<std::pair<int,_int>_> *in_stack_00000020;
  QArrayDataPointer<std::pair<int,_int>_> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<std::pair<int,_int>_>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<std::pair<int,_int>_>::operator->(&this->d);
    QArrayDataPointer<std::pair<int,_int>_>::operator->(&this->d);
    QArrayDataPointer<std::pair<int,_int>_>::begin
              ((QArrayDataPointer<std::pair<int,_int>_> *)0x8a7329);
    QtPrivate::QPodArrayOps<std::pair<int,_int>_>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}